

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbif.cpp
# Opt level: O0

char * CVmBif::pop_list_val(void)

{
  int iVar1;
  CVmObject *pCVar2;
  undefined4 extraout_var;
  char *p;
  CVmObject *obj;
  vm_val_t val;
  undefined8 in_stack_ffffffffffffffd8;
  pool_ofs_t ofs;
  CVmPoolInMem *in_stack_ffffffffffffffe0;
  vm_val_t local_18;
  char *local_8;
  
  ofs = (pool_ofs_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  CVmStack::pop(&local_18);
  if (local_18.typ == VM_OBJ) {
    pCVar2 = vm_objp(0);
    iVar1 = (*pCVar2->_vptr_CVmObject[0x32])();
    local_8 = (char *)CONCAT44(extraout_var,iVar1);
    if (local_8 == (char *)0x0) goto LAB_002f4838;
  }
  else {
    if (local_18.typ != VM_LIST) {
LAB_002f4838:
      err_throw(0);
    }
    local_8 = CVmPoolInMem::get_ptr(in_stack_ffffffffffffffe0,ofs);
  }
  return local_8;
}

Assistant:

const char *CVmBif::pop_list_val(VMG0_)
{
    vm_val_t val;
    CVmObject *obj;
    const char *p;

    /* pop the value */
    G_stk->pop(&val);

    /* see what we have */
    switch(val.typ)
    {
    case VM_LIST:
        /* it's a constant list - get the constant pool pointer */
        return G_const_pool->get_ptr(val.val.ofs);

    case VM_OBJ:
        /* get the object */
        obj = vm_objp(vmg_ val.val.obj);

        /* get the list value, if it has one */
        p = obj->get_as_list();

        /* if it has a list value, return it */
        if (p != 0)
            return p;

        /* we didn't get a list value */
        break;

    default:
        /* other types don't have a list value */
        break;
    }

    /* if we got here, the value isn't a list */
    err_throw(VMERR_LIST_VAL_REQD);
    AFTER_ERR_THROW(return 0;)
}